

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  EnumDescriptor *pEVar2;
  ctrl_t *pcVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  uint64_t v_3;
  slot_type *ppEVar7;
  uintptr_t v;
  ulong uVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t hash;
  byte bVar9;
  size_t sVar10;
  ctrl_t cVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  slot_type *local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  if (sVar1 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                *)common);
    bVar14 = 1 < common->size_;
  }
  else {
    bVar14 = false;
  }
  bVar9 = 0x80;
  if (bVar14 != false) {
    ppEVar7 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                        *)common);
    pEVar2 = (*ppEVar7)->type_;
    uVar8 = ((ulong)pEVar2 ^ 0x463ad8) * -0x234dd359734ecb13;
    uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18
              | (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18
              | (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)pEVar2) * -0x234dd359734ecb13;
    bVar9 = (byte)(((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                     (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                     (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                     (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)(uint)(*ppEVar7)->number_) *
                   0x5cb22ca68cb134ed >> 0x38) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_36 = bVar14;
  CommonFields::set_capacity(common,new_capacity);
  bVar6 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar9,8,8);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::EnumValueDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::EnumValueDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::EnumValueDescriptor *>]"
                 );
  }
  if ((bVar14 | sVar1 != 1) == 1) {
    local_58 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::EnumValueDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                           *)common);
    uVar5 = local_50.heap.slot_array;
    if (!bVar6) {
      if (sVar1 == 1) {
        uVar8 = ((ulong)*(EnumDescriptor **)(local_50.heap.control + 0x10) ^ 0x463ad8) *
                -0x234dd359734ecb13;
        uVar8 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                 | uVar8 << 0x38) ^ (ulong)*(EnumDescriptor **)(local_50.heap.control + 0x10)) *
                -0x234dd359734ecb13;
        uVar12 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                   (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                   (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38) ^ (ulong)*(uint *)(local_50.heap.control + 4)) *
                 -0x234dd359734ecb13;
        FVar15 = find_first_non_full<void>
                           ((container_internal *)common,
                            (CommonFields *)
                            (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                             (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),0xdcb22ca68cb134ed);
        uVar13 = FVar15.offset;
        uVar8 = common->capacity_;
        if (uVar8 <= uVar13) {
LAB_00172dcf:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar13] = cVar11;
        pcVar3[(ulong)((uint)uVar8 & 0xf) + (uVar13 - 0xf & uVar8)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        local_58[uVar13] = (slot_type)local_50.heap.control;
        CommonFields::set_capacity(common,uVar8);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar10 = 0;
          hash = extraout_RDX;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar10]) {
              lVar4 = *(long *)(uVar5 + sVar10 * 8);
              uVar8 = *(ulong *)(lVar4 + 0x10);
              uVar13 = (uVar8 ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13
              ;
              uVar8 = ((uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                        (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                        (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                        (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38) ^ uVar8) * -0x234dd359734ecb13;
              uVar12 = ((uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                         (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                         (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38) ^ (ulong)*(uint *)(lVar4 + 4)) *
                       -0x234dd359734ecb13;
              FVar15 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash);
              uVar13 = FVar15.offset;
              uVar8 = common->capacity_;
              if (uVar8 <= uVar13) goto LAB_00172dcf;
              cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar13] = cVar11;
              pcVar3[(ulong)((uint)uVar8 & 0xf) + (uVar13 - 0xf & uVar8)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              local_58[uVar13] = *(slot_type *)(uVar5 + sVar10 * 8);
              CommonFields::set_capacity(common,uVar8);
              hash = extraout_RDX_00;
            }
            sVar10 = sVar10 + 1;
          } while (sVar10 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }